

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall
CDirectivePosition::CDirectivePosition(CDirectivePosition *this,Type type,ArgumentList *Args)

{
  bool bVar1;
  Entry *pEVar2;
  ArgumentList *Args_local;
  Type type_local;
  CDirectivePosition *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectivePosition_001f2bb0;
  this->type = type;
  pEVar2 = ArgumentList::operator[](Args,0);
  bVar1 = ConvertExpression(&pEVar2->text,&this->position);
  if (!bVar1) {
    pEVar2 = ArgumentList::operator[](Args,0);
    Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid ram address %s",&pEVar2->text);
  }
  exec(this);
  Global.Section = Global.Section + 1;
  return;
}

Assistant:

CDirectivePosition::CDirectivePosition(Type type, ArgumentList& Args)
	: type(type)
{
	if (ConvertExpression(Args[0].text,position) == false)
	{
		Logger::printError(Logger::FatalError,L"Invalid ram address %s",Args[0].text);
	}
	
	exec();
	Global.Section++;
}